

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::TextFormat::Print(Message *message,ZeroCopyOutputStream *output)

{
  bool bVar1;
  Printer *this;
  Printer *in_stack_ffffffffffffff70;
  ZeroCopyOutputStream *in_stack_ffffffffffffff90;
  _Base_ptr in_stack_ffffffffffffff98;
  Printer *in_stack_ffffffffffffffa0;
  
  this = (Printer *)&stack0xffffffffffffff68;
  Printer::Printer(in_stack_ffffffffffffff70);
  bVar1 = Printer::Print(in_stack_ffffffffffffffa0,(Message *)in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90);
  Printer::~Printer(this);
  return bVar1;
}

Assistant:

bool TextFormat::Print(const Message& message,
                                    io::ZeroCopyOutputStream* output) {
  return Printer().Print(message, output);
}